

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eodata.cpp
# Opt level: O1

int read_single_file<ECF>(ECF *pub,Pub_File *file,bool auto_split,int version,int first_id)

{
  pointer *ppuVar1;
  pointer puVar2;
  pointer pEVar3;
  iterator __position;
  Pub_File *pPVar4;
  int iVar5;
  int iVar6;
  FILE *__stream;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uchar uVar11;
  string *psVar12;
  ulong uVar13;
  ulong uVar14;
  uchar namesize;
  size_t last_split;
  string name;
  char buf [14];
  string shout;
  uchar local_b3;
  byte local_b2;
  byte local_b1;
  Pub_File *local_b0;
  unsigned_long local_a8;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_a0;
  char *local_98;
  ulong local_90;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  char local_68 [16];
  ulong local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  __stream = fopen((file->filename)._M_dataplus._M_p,"rb");
  eodata_safe_fail_filename = (file->filename)._M_dataplus._M_p;
  local_b0 = file;
  if (__stream == (FILE *)0x0) {
    Console::Err("Could not load file: %s");
  }
  else {
    local_b2 = first_id == 1 && auto_split;
    uVar10 = 0xfa;
    if (0 < version) {
      uVar10 = 900;
    }
    local_90 = 64000;
    if (first_id != 1 || !auto_split) {
      local_90 = (ulong)uVar10;
    }
    local_88 = &local_78;
    if (0 < version) {
      local_90 = (ulong)uVar10;
    }
    local_80 = 0;
    local_78 = 0;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    local_68[0] = '\0';
    local_68[1] = '\0';
    local_68[2] = '\0';
    local_68[3] = '\0';
    local_68[4] = '\0';
    local_68[5] = '\0';
    local_68[6] = '\0';
    local_68[7] = '\0';
    local_68[8] = '\0';
    local_68[9] = '\0';
    local_68[10] = '\0';
    local_68[0xb] = '\0';
    local_68[0xc] = '\0';
    local_68[0xd] = '\0';
    iVar5 = fseek(__stream,10,0);
    if (iVar5 == 0) {
      sVar7 = fread(&local_b3,1,1,__stream);
      if (sVar7 == 1) {
        local_a0 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&local_b0->splits;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a0,4);
        local_58 = (ulong)(uint)first_id;
        local_b1 = local_b2 ^ 1;
        local_98 = "Auto-split file is too large (%d bytes too long): %s";
        uVar14 = 0;
        do {
          iVar5 = (int)uVar14;
          if ((int)((uVar14 & 0xffffffff) / 0xfa) * -0xfa + iVar5 == 0 && local_b1 == 0) {
            lVar8 = ftell(__stream);
            puVar2 = (local_b0->splits).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if ((local_b0->splits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_start == puVar2) {
              uVar10 = 0xffffffff;
            }
            else {
              uVar10 = ~(uint)puVar2[-1];
            }
            iVar6 = (int)lVar8 + uVar10;
            if (0xf9f8 < iVar6) {
              Console::Err("Auto-split file is too large (%d bytes too long): %s",
                           (ulong)(iVar6 - 0xf9f8),(local_b0->filename)._M_dataplus._M_p);
            }
            lVar8 = ftell(__stream);
            local_a8 = lVar8 - 1;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a0,&local_a8);
          }
          uVar10 = PacketProcessor::Number(local_b3,0xfe,0xfe,0xfe);
          uVar11 = (uchar)uVar10;
          local_b3 = uVar11;
          std::__cxx11::string::resize((ulong)&local_88,uVar11);
          if (uVar11 != '\0') {
            sVar7 = fread(local_88,1,(ulong)(uVar10 & 0xff),__stream);
            if (sVar7 != (uVar10 & 0xff)) {
              fclose(__stream);
              Console::Err("Invalid file / failed read/seek: %s -- %i",eodata_safe_fail_filename,
                           0xd5);
              goto LAB_001390ab;
            }
          }
          sVar7 = fread(local_68,1,0xe,__stream);
          if (sVar7 != 0xe) {
            fclose(__stream);
            Console::Err("Invalid file / failed read/seek: %s -- %i",eodata_safe_fail_filename,0xe0)
            ;
            goto LAB_001390ab;
          }
          iVar6 = (int)local_58 + iVar5;
          uVar13 = (ulong)iVar6;
          pEVar3 = (pub->data).
                   super__Vector_base<ECF_Data_Base<ECF>,_std::allocator<ECF_Data_Base<ECF>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          psVar12 = &pEVar3[uVar13].name;
          *(int *)((long)(psVar12 + -1) + 0x18) = iVar6;
          std::__cxx11::string::_M_assign((string *)psVar12);
          pub_read_record(pEVar3 + uVar13,local_68);
          uVar9 = ((long)(pub->data).
                         super__Vector_base<ECF_Data_Base<ECF>,_std::allocator<ECF_Data_Base<ECF>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pub->data).
                         super__Vector_base<ECF_Data_Base<ECF>,_std::allocator<ECF_Data_Base<ECF>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
          if (uVar9 < uVar13 || uVar9 - uVar13 == 0) {
LAB_00138f36:
            iVar5 = iVar5 + 1;
            goto LAB_00138f39;
          }
          sVar7 = fread(&local_b3,1,1,__stream);
          if (sVar7 != 1) goto LAB_00138f36;
          uVar14 = uVar14 + 1;
          if (local_90 == uVar14) {
            iVar5 = (int)local_90;
LAB_00138f39:
            local_a8 = ftell(__stream);
            pPVar4 = local_b0;
            puVar2 = (local_b0->splits).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            iVar6 = (int)local_a8 - (int)puVar2[-1];
            if (0xf9f8 < iVar6) {
              if ((local_b2 == 0) || ((ulong)((long)puVar2 - *(long *)local_a0) < 9)) {
                local_98 = "File is too large (%d bytes too long): %s";
              }
              Console::Err(local_98,(ulong)(iVar6 - 0xf9f8),(local_b0->filename)._M_dataplus._M_p);
            }
            __position._M_current =
                 (pPVar4->splits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (pPVar4->splits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>(local_a0,__position,&local_a8);
            }
            else {
              *__position._M_current = local_a8;
              ppuVar1 = &(pPVar4->splits).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
            fclose(__stream);
            if (local_50 != &local_40) {
              operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
            }
            if (local_88 != &local_78) {
              operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
            }
            return iVar5;
          }
        } while( true );
      }
      fclose(__stream);
      Console::Err("Invalid file / failed read/seek: %s -- %i",eodata_safe_fail_filename,0xbb);
    }
    else {
      fclose(__stream);
      Console::Err("Invalid file / failed read/seek: %s -- %i",eodata_safe_fail_filename,0xba);
    }
  }
LAB_001390ab:
  exit(1);
}

Assistant:

int read_single_file(T& pub, Pub_File& file, bool auto_split, int version, int first_id)
{
	std::FILE *fh = std::fopen(file.filename.c_str(), "rb");
	eodata_safe_fail_filename = file.filename.c_str();

	if (!fh)
	{
		Console::Err("Could not load file: %s", file.filename.c_str());
		std::exit(1);
	}

	// Only attempt to auto-split the first file
	if (first_id != 1)
		auto_split = false;

	unsigned char namesize, shoutsize;
	std::string name, shout;
	char buf[T::DATA_SIZE] = {0};

	int readobj = 0;
	int max_entries = T::FILE_MAX_ENTRIES;

	if constexpr (std::is_same_v<T, ECF>)
	{
		if (version >= 1)
			max_entries = T::FILE_MAX_ENTRIES_V2;
	}

	if (version < 1 && auto_split == true)
		max_entries = 64000;

	SAFE_SEEK(fh, 10, SEEK_SET);
	SAFE_READ(static_cast<void *>(&namesize), sizeof(char), 1, fh);

	if constexpr (std::is_same_v<T, ESF>)
	{
		SAFE_READ(static_cast<void *>(&shoutsize), sizeof(char), 1, fh);
	}

	file.splits.reserve(4);

	for (int i = 0; i < max_entries; ++i)
	{
		if (auto_split && (i % T::FILE_MAX_ENTRIES == 0))
		{
			std::size_t split = std::size_t(std::ftell(fh)) - 1;
			int size = (int)split - (file.splits.empty() ? 0 : (int)file.splits.back());

			if (size > 63992)
				Console::Err("Auto-split file is too large (%d bytes too long): %s", size - 63992, file.filename.c_str());

			file.splits.push_back(std::size_t(std::ftell(fh)) - 1);
		}

		namesize = PacketProcessor::Number(namesize);
		name.resize(namesize);

		if (namesize > 0)
			SAFE_READ(&name[0], sizeof(char), namesize, fh);

		if constexpr (std::is_same_v<T, ESF>)
		{
			shoutsize = PacketProcessor::Number(shoutsize);
			shout.resize(shoutsize);

			if (shoutsize > 0)
				SAFE_READ(&shout[0], sizeof(char), shoutsize, fh);
		}

		SAFE_READ(buf, sizeof(char), T::DATA_SIZE, fh);

		typename T::data_t& newdata = pub.data[first_id + i];

		++readobj;

		newdata.id = first_id + i;
		newdata.name = name;

		if constexpr (std::is_same_v<T, ESF>)
		{
			newdata.shout = shout;
		}

		pub_read_record(newdata, buf);

		if (first_id + i >= pub.data.size()
		 || std::fread(static_cast<void *>(&namesize), sizeof(char), 1, fh) != 1)
		{
			break;
		}

		if constexpr (std::is_same_v<T, ESF>)
		{
			if (std::fread(static_cast<void *>(&shoutsize), sizeof(char), 1, fh) != 1)
			{
				break;
			}
		}
	}

	std::size_t last_split = std::size_t(std::ftell(fh));
	int size = (int)last_split - (int)file.splits.back();

	if (size > 63992)
	{
		if (auto_split && file.splits.size() > 1)
			Console::Err("Auto-split file is too large (%d bytes too long): %s", size - 63992, file.filename.c_str());
		else
			Console::Err("File is too large (%d bytes too long): %s", size - 63992, file.filename.c_str());
	}

	file.splits.push_back(last_split);

	std::fclose(fh);

	return readobj;
}